

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP3Writer::InitParameters(BP3Writer *this)

{
  IO *pIVar1;
  _func_int *p_Var2;
  size_t dataIn;
  BP3Serializer *pBVar3;
  string local_88;
  string local_68;
  string local_48;
  
  pIVar1 = (this->super_Engine).m_IO;
  p_Var2 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"in call to BP3::Open for writing","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  pBVar3 = &this->m_BP3Serializer;
  adios2::format::BPBase::Init
            ((BPBase *)((long)&(pBVar3->super_BP3Base)._vptr_BP3Base + (long)p_Var2),
             &pIVar1->m_Parameters,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  p_Var2 = (pBVar3->super_BP3Base)._vptr_BP3Base[-3];
  dataIn = *(size_t *)(p_Var2 + 0x208 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"in call to BP3::Open to write","");
  adios2::format::BPBase::ResizeBuffer
            ((BPBase *)((long)&(pBVar3->super_BP3Base)._vptr_BP3Base + (long)p_Var2),dataIn,
             &local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BP3Writer::InitParameters()
{
    m_BP3Serializer.Init(m_IO.m_Parameters, "in call to BP3::Open for writing");
    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP3::Open to write");
}